

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<SuperClass>::moveAppend
          (QGenericArrayOps<SuperClass> *this,SuperClass *b,SuperClass *e)

{
  qsizetype *pqVar1;
  SuperClass *pSVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<SuperClass>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<SuperClass>).size;
      pDVar4 = (b->classname).d.d;
      (b->classname).d.d = (Data *)0x0;
      pSVar2[lVar3].classname.d.d = pDVar4;
      pcVar5 = (b->classname).d.ptr;
      (b->classname).d.ptr = (char *)0x0;
      pSVar2[lVar3].classname.d.ptr = pcVar5;
      qVar6 = (b->classname).d.size;
      (b->classname).d.size = 0;
      pSVar2[lVar3].classname.d.size = qVar6;
      pDVar4 = (b->qualified).d.d;
      (b->qualified).d.d = (Data *)0x0;
      pSVar2[lVar3].qualified.d.d = pDVar4;
      pcVar5 = (b->qualified).d.ptr;
      (b->qualified).d.ptr = (char *)0x0;
      pSVar2[lVar3].qualified.d.ptr = pcVar5;
      qVar6 = (b->qualified).d.size;
      (b->qualified).d.size = 0;
      pSVar2[lVar3].qualified.d.size = qVar6;
      pSVar2[lVar3].access = b->access;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<SuperClass>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }